

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

char * duplicate_as_str(void *src,size_t len)

{
  char *__dest;
  
  __dest = (char *)malloc(len + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,src,len);
    __dest[len] = '\0';
  }
  return __dest;
}

Assistant:

static char *duplicate_as_str(const void *src, size_t len)
{
    char *dst;

    if ((dst = malloc(len + 1)) == NULL)
        return NULL;
    memcpy(dst, src, len);
    dst[len] = '\0';
    return dst;
}